

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::UniformCase::writeUniformComparisons
          (UniformCase *this,ostringstream *dst,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,char *variableName)

{
  pointer pBVar1;
  size_t sVar2;
  ostringstream *poVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  UniformCase *this_00;
  long lVar7;
  
  pBVar1 = (basicUniforms->
           super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(basicUniforms->
                              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3) *
          0x286bca1b) {
    lVar5 = 0;
    lVar7 = 0;
    do {
      if ((&pBVar1->isUsedInShader)[lVar5] == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\t",1);
        if (variableName == (char *)0x0) {
          std::ios::clear((int)dst +
                          (int)(dst->super_basic_ostream<char,_std::char_traits<char>_>).
                               _vptr_basic_ostream[-3]);
        }
        else {
          sVar2 = strlen(variableName);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&dst->super_basic_ostream<char,_std::char_traits<char>_>,variableName,sVar2);
        }
        this_00 = (UniformCase *)dst;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&dst->super_basic_ostream<char,_std::char_traits<char>_>," *= ",4);
        writeUniformCompareExpr
                  (this_00,dst,
                   (BasicUniform *)
                   ((long)&(((basicUniforms->
                             super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                             )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                   lVar5));
        lVar4 = 2;
        pcVar6 = ";\n";
        poVar3 = dst;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\t// UNUSED: ",0xc);
        pBVar1 = (basicUniforms->
                 super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar3 = (ostringstream *)
                 std::__ostream_insert<char,std::char_traits<char>>
                           (&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                            *(char **)((long)&(pBVar1->name)._M_dataplus._M_p + lVar5),
                            *(long *)((long)&(pBVar1->name)._M_string_length + lVar5));
        lVar4 = 1;
        pcVar6 = "\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&poVar3->super_basic_ostream<char,_std::char_traits<char>_>,pcVar6,lVar4);
      lVar7 = lVar7 + 1;
      pBVar1 = (basicUniforms->
               super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x98;
    } while (lVar7 < (int)((ulong)((long)(basicUniforms->
                                         super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1)
                          >> 3) * 0x286bca1b);
  }
  return;
}

Assistant:

void UniformCase::writeUniformComparisons (std::ostringstream& dst, const vector<BasicUniform>& basicUniforms, const char* const variableName) const
{
	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		const BasicUniform& unif = basicUniforms[i];

		if (unif.isUsedInShader)
		{
			dst << "\t" << variableName << " *= ";
			writeUniformCompareExpr(dst, basicUniforms[i]);
			dst << ";\n";
		}
		else
			dst << "\t// UNUSED: " << basicUniforms[i].name << "\n";
	}
}